

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac_next_cuesheet_track
                    (ma_dr_flac_cuesheet_track_iterator *pIter,
                    ma_dr_flac_cuesheet_track *pCuesheetTrack)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ma_bool32 mVar8;
  
  mVar8 = 0;
  if (((pIter != (ma_dr_flac_cuesheet_track_iterator *)0x0) && (pIter->countRemaining != 0)) &&
     (puVar4 = (ulong *)pIter->pRunningData, puVar4 != (ulong *)0x0)) {
    uVar5 = *puVar4;
    uVar7 = puVar4[1];
    uVar3 = *(undefined4 *)((long)puVar4 + 0x11);
    uVar6 = *(undefined8 *)((long)puVar4 + 9);
    bVar1 = *(byte *)((long)puVar4 + 0x15);
    bVar2 = *(byte *)((long)puVar4 + 0x23);
    pIter->pRunningData = (char *)((long)puVar4 + (ulong)bVar2 * 0x10 + 0x24);
    pIter->countRemaining = pIter->countRemaining - 1;
    mVar8 = 1;
    if (pCuesheetTrack != (ma_dr_flac_cuesheet_track *)0x0) {
      pCuesheetTrack->offset =
           uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
           (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
           (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      pCuesheetTrack->trackNumber = (ma_uint8)uVar7;
      *(undefined8 *)pCuesheetTrack->ISRC = uVar6;
      *(undefined4 *)(pCuesheetTrack->ISRC + 8) = uVar3;
      pCuesheetTrack->isAudio = bVar1 >> 7;
      pCuesheetTrack->preEmphasis = bVar1 >> 6 & 1;
      pCuesheetTrack->indexCount = bVar2;
      pCuesheetTrack->pIndexPoints = (ma_dr_flac_cuesheet_track_index *)((long)puVar4 + 0x24);
    }
  }
  return mVar8;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_next_cuesheet_track(ma_dr_flac_cuesheet_track_iterator* pIter, ma_dr_flac_cuesheet_track* pCuesheetTrack)
{
    ma_dr_flac_cuesheet_track cuesheetTrack;
    const char* pRunningData;
    ma_uint64 offsetHi;
    ma_uint64 offsetLo;
    if (pIter == NULL || pIter->countRemaining == 0 || pIter->pRunningData == NULL) {
        return MA_FALSE;
    }
    pRunningData = pIter->pRunningData;
    offsetHi                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    offsetLo                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    cuesheetTrack.offset       = offsetLo | (offsetHi << 32);
    cuesheetTrack.trackNumber  = pRunningData[0];                                         pRunningData += 1;
    MA_DR_FLAC_COPY_MEMORY(cuesheetTrack.ISRC, pRunningData, sizeof(cuesheetTrack.ISRC));     pRunningData += 12;
    cuesheetTrack.isAudio      = (pRunningData[0] & 0x80) != 0;
    cuesheetTrack.preEmphasis  = (pRunningData[0] & 0x40) != 0;                           pRunningData += 14;
    cuesheetTrack.indexCount   = pRunningData[0];                                         pRunningData += 1;
    cuesheetTrack.pIndexPoints = (const ma_dr_flac_cuesheet_track_index*)pRunningData;        pRunningData += cuesheetTrack.indexCount * sizeof(ma_dr_flac_cuesheet_track_index);
    pIter->pRunningData = pRunningData;
    pIter->countRemaining -= 1;
    if (pCuesheetTrack) {
        *pCuesheetTrack = cuesheetTrack;
    }
    return MA_TRUE;
}